

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O0

uint8_t * flatbuffers::ResizeAnyVector
                    (Schema *schema,uoffset_t newsize,VectorOfAny *vec,uoffset_t num_elems,
                    uoffset_t elem_size,
                    vector<unsigned_char,_std::allocator<unsigned_char>_> *flatbuf,
                    Object *root_table)

{
  int iVar1;
  uchar *puVar2;
  uchar *puVar3;
  undefined1 local_80 [8];
  ResizeContext ctx;
  uoffset_t size_clear;
  uoffset_t start;
  long vec_start;
  int delta_bytes;
  int delta_elem;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *flatbuf_local;
  uoffset_t elem_size_local;
  uoffset_t num_elems_local;
  VectorOfAny *vec_local;
  uoffset_t newsize_local;
  Schema *schema_local;
  
  iVar1 = newsize - num_elems;
  puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(flatbuf);
  ctx.dag_check_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ =
       (int)((long)vec - (long)puVar2) + 4 + elem_size * num_elems;
  if (iVar1 * elem_size != 0) {
    if (iVar1 < 0) {
      ctx.dag_check_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = -iVar1 * elem_size;
      puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(flatbuf);
      memset(puVar3 + ((ulong)ctx.dag_check_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ -
                      (ulong)(uint)ctx.dag_check_.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage),0,
             (ulong)(uint)ctx.dag_check_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
    }
    ResizeContext::ResizeContext
              ((ResizeContext *)local_80,schema,
               ctx.dag_check_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,iVar1 * elem_size,flatbuf,
               root_table);
    puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(flatbuf);
    WriteScalar<unsigned_int>(puVar3 + ((long)vec - (long)puVar2),newsize);
    if (0 < iVar1) {
      puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(flatbuf);
      memset(puVar2 + ctx.dag_check_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_,0,
             (long)iVar1 * (ulong)elem_size);
    }
    ResizeContext::~ResizeContext((ResizeContext *)local_80);
  }
  puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(flatbuf);
  return puVar2 + ctx.dag_check_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

uint8_t *ResizeAnyVector(const reflection::Schema &schema, uoffset_t newsize,
                         const VectorOfAny *vec, uoffset_t num_elems,
                         uoffset_t elem_size, std::vector<uint8_t> *flatbuf,
                         const reflection::Object *root_table) {
  auto delta_elem = static_cast<int>(newsize) - static_cast<int>(num_elems);
  auto delta_bytes = delta_elem * static_cast<int>(elem_size);
  auto vec_start = reinterpret_cast<const uint8_t *>(vec) - flatbuf->data();
  auto start = static_cast<uoffset_t>(vec_start) +
               static_cast<uoffset_t>(sizeof(uoffset_t)) +
               elem_size * num_elems;
  if (delta_bytes) {
    if (delta_elem < 0) {
      // Clear elements we're throwing away, since some might remain in the
      // buffer.
      auto size_clear = -delta_elem * elem_size;
      memset(flatbuf->data() + start - size_clear, 0, size_clear);
    }
    ResizeContext ctx(schema, start, delta_bytes, flatbuf, root_table);
    WriteScalar(flatbuf->data() + vec_start, newsize);  // Length field.
    // Set new elements to 0.. this can be overwritten by the caller.
    if (delta_elem > 0) {
      memset(flatbuf->data() + start, 0,
             static_cast<size_t>(delta_elem) * elem_size);
    }
  }
  return flatbuf->data() + start;
}